

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t gt_virt_cnt_offset(CPUARMState_conflict *env)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 0) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((~uVar2 & 0x408000000) == 0) {
      return 0;
    }
  }
  else if ((iVar1 == 2) && (uVar2 = arm_hcr_el2_eff_aarch64(env), (uVar2 & 0x400000000) != 0)) {
    return 0;
  }
  return (env->cp15).cntvoff_el2;
}

Assistant:

static uint64_t gt_virt_cnt_offset(CPUARMState *env)
{
    uint64_t hcr;

    switch (arm_current_el(env)) {
    case 2:
        hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_E2H) {
            return 0;
        }
        break;
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            return 0;
        }
        break;
    }

    return env->cp15.cntvoff_el2;
}